

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

void __thiscall
wasm::IRBuilder::ChildPopper::ConstraintCollector::noteAnyType
          (ConstraintCollector *this,Expression **childp)

{
  Child local_20;
  
  local_20.constraint.
  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  ._M_index = '\x01';
  local_20.childp = childp;
  std::
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::emplace_back<wasm::IRBuilder::ChildPopper::Child>(this->children,&local_20);
  return;
}

Assistant:

void noteAnyType(Expression** childp) {
      children.push_back({childp, {AnyType{}}});
    }